

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O0

void sexp_release_object(sexp_conflict ctx,sexp_conflict x)

{
  bool bVar1;
  sexp_conflict ls2;
  sexp_conflict ls1;
  sexp_conflict x_local;
  sexp_conflict ctx_local;
  
  ls1 = (sexp_conflict)0x0;
  ls2 = (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[8].start;
  while( true ) {
    bVar1 = false;
    if (((ulong)ls2 & 3) == 0) {
      bVar1 = ls2->tag == 6;
    }
    if (!bVar1) break;
    if ((ls2->value).type.name == x) {
      if (ls1 == (sexp_conflict)0x0) {
        (((ctx->value).type.setters)->value).context.mark_stack[8].start =
             (sexp_conflict *)(ls2->value).type.cpl;
      }
      else {
        (ls1->value).type.cpl = (ls2->value).type.cpl;
      }
      return;
    }
    ls1 = ls2;
    ls2 = (ls2->value).type.cpl;
  }
  return;
}

Assistant:

void sexp_release_object(sexp ctx, sexp x) {
  sexp ls1, ls2;
  for (ls1=NULL, ls2=sexp_global(ctx, SEXP_G_PRESERVATIVES); sexp_pairp(ls2);
       ls1=ls2, ls2=sexp_cdr(ls2))
    if (sexp_car(ls2) == x) {
      if (ls1) sexp_cdr(ls1) = sexp_cdr(ls2);
      else sexp_global(ctx, SEXP_G_PRESERVATIVES) = sexp_cdr(ls2);
      break;
    }
}